

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::SetEmailLogging(LogSeverity min_severity,char *addresses)

{
  LogDestination::SetEmailLogging(min_severity,addresses);
  return;
}

Assistant:

void SetEmailLogging(LogSeverity min_severity, const char* addresses) {
  LogDestination::SetEmailLogging(min_severity, addresses);
}